

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O1

bool __thiscall QItemSelectionModel::isSelected(QItemSelectionModel *this,QModelIndex *index)

{
  QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
  *this_00;
  QItemSelection *this_01;
  long lVar1;
  parameter_type pQVar2;
  QAbstractItemModel *pQVar3;
  bool bVar4;
  uint uVar5;
  parameter_type pQVar6;
  QItemSelectionRange *pQVar7;
  long lVar8;
  QItemSelectionRange *pQVar9;
  QItemSelectionRange *this_02;
  
  lVar1 = *(long *)(this + 8);
  this_00 = (QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
             *)(lVar1 + 0x78);
  pQVar6 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
           ::value(this_00);
  pQVar2 = (index->m).ptr;
  if (pQVar6 != pQVar2) {
    return false;
  }
  if (pQVar2 == (parameter_type)0x0) {
    return false;
  }
  if (index->r < 0) {
    return false;
  }
  if (index->c < 0) {
    return false;
  }
  this_02 = *(QItemSelectionRange **)(lVar1 + 0x88);
  pQVar7 = this_02 + *(long *)(lVar1 + 0x90);
  lVar8 = *(long *)(lVar1 + 0x90) >> 2;
  if (0 < lVar8) {
    lVar8 = lVar8 + 1;
    do {
      bVar4 = QItemSelectionRange::contains(this_02,index);
      pQVar9 = this_02;
      if (bVar4) goto LAB_0046e259;
      bVar4 = QItemSelectionRange::contains(this_02 + 1,index);
      pQVar9 = this_02 + 1;
      if (bVar4) goto LAB_0046e259;
      bVar4 = QItemSelectionRange::contains(this_02 + 2,index);
      pQVar9 = this_02 + 2;
      if (bVar4) goto LAB_0046e259;
      bVar4 = QItemSelectionRange::contains(this_02 + 3,index);
      pQVar9 = this_02 + 3;
      if (bVar4) goto LAB_0046e259;
      this_02 = this_02 + 4;
      lVar8 = lVar8 + -1;
    } while (1 < lVar8);
  }
  lVar8 = (long)pQVar7 - (long)this_02 >> 4;
  if (lVar8 != 1) {
    if (lVar8 != 2) {
      pQVar9 = pQVar7;
      if ((lVar8 != 3) ||
         (bVar4 = QItemSelectionRange::contains(this_02,index), pQVar9 = this_02, bVar4))
      goto LAB_0046e259;
      this_02 = this_02 + 1;
    }
    bVar4 = QItemSelectionRange::contains(this_02,index);
    pQVar9 = this_02;
    if (bVar4) goto LAB_0046e259;
    this_02 = this_02 + 1;
  }
  bVar4 = QItemSelectionRange::contains(this_02,index);
  pQVar9 = this_02;
  if (!bVar4) {
    pQVar9 = pQVar7;
  }
LAB_0046e259:
  bVar4 = pQVar9 != pQVar7;
  if (*(long *)(lVar1 + 0xa8) != 0) {
    this_01 = (QItemSelection *)(lVar1 + 0x98);
    uVar5 = *(uint *)(lVar1 + 0xb8);
    if ((uVar5 & 4) == 0 || pQVar9 == pQVar7) {
      if ((uVar5 & 8) == 0) {
        if ((uVar5 & 2) != 0 && pQVar9 == pQVar7) {
          bVar4 = QItemSelection::contains(this_01,index);
        }
      }
      else {
        bVar4 = QItemSelection::contains(this_01,index);
        bVar4 = bVar4 != (pQVar9 != pQVar7);
      }
    }
    else {
      bVar4 = QItemSelection::contains(this_01,index);
      bVar4 = !bVar4;
    }
  }
  if (bVar4 == false) {
    return false;
  }
  QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
  ::value(this_00);
  pQVar3 = (this_00->super_QPropertyData<QAbstractItemModel_*>).val;
  uVar5 = (*(pQVar3->super_QObject)._vptr_QObject[0x27])(pQVar3,index);
  return (~uVar5 & 0x21) == 0;
}

Assistant:

bool QItemSelectionModel::isSelected(const QModelIndex &index) const
{
    Q_D(const QItemSelectionModel);
    if (d->model != index.model() || !index.isValid())
        return false;

    //  search model ranges
    auto contains = [](const auto &index) {
        return [&index](const auto &range) { return range.contains(index); };
    };
    bool selected = std::any_of(d->ranges.begin(), d->ranges.end(), contains(index));

    // check  currentSelection
    if (d->currentSelection.size()) {
        if ((d->currentCommand & Deselect) && selected)
            selected = !d->currentSelection.contains(index);
        else if (d->currentCommand & Toggle)
            selected ^= d->currentSelection.contains(index);
        else if ((d->currentCommand & Select) && !selected)
            selected = d->currentSelection.contains(index);
    }

    if (selected)
        return isSelectableAndEnabled(d->model->flags(index));

    return false;
}